

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest5::iterate(FunctionalTest5 *this)

{
  GLuint *subroutine_combination;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  GLint GVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  char *description;
  GLuint routine;
  long lVar10;
  char *__filename;
  FunctionalTest5 *this_01;
  GLuint type;
  long lVar11;
  GLuint (*paGVar12) [2];
  GLchar *(*papGVar13) [2];
  buffer transform_feedback_buffer;
  vertexArray vao;
  program program;
  vec4<float> third_routine_result;
  vec4<float> second_routine_result;
  vec4<float> first_routine_result;
  vec4<unsigned_int> fourth_routine_result;
  
  if (iterate()::input_data == '\0') {
    iterate();
  }
  if (iterate()::expected_result_from_first_routine == '\0') {
    iterate();
  }
  if (iterate()::expected_result_from_second_routine == '\0') {
    iterate();
  }
  if (iterate()::expected_result_from_third_routine == '\0') {
    iterate();
  }
  if (iterate()::expected_result_from_fourth_routine == '\0') {
    iterate();
  }
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar5) {
    transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    transform_feedback_buffer.m_id = 0;
    vao.m_id = 0;
    vao.m_context = transform_feedback_buffer.m_context;
    program.m_context = transform_feedback_buffer.m_context;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine types\nsubroutine vec4  routine_type_1(in vec4 left, in vec4 right);\nsubroutine vec4  routine_type_2(in vec4 iparam);\nsubroutine vec4  routine_type_3(in vec4 a,    in vec4 b,    in vec4 c);\nsubroutine bvec4 routine_type_4(in vec4 left, in vec4 right);\n\n// Subroutine definitions\n// 1st type\nsubroutine(routine_type_1) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type_1) vec4 subtract(in vec4 left, in vec4 right)\n{\n    return left - right;\n}\n\n// 2nd type\nsubroutine(routine_type_2) vec4 square(in vec4 iparam)\n{\n    return iparam * iparam;\n}\n\nsubroutine(routine_type_2) vec4 square_root(in vec4 iparam)\n{\n    return sqrt(iparam);\n}\n\n// 3rd type\nsubroutine(routine_type_3) vec4 do_fma(in vec4 a, in vec4 b, in vec4 c)\n{\n    return fma(a, b, c);\n}\n\nsubroutine(routine_type_3) vec4 blend(in vec4 a, in vec4 b, in vec4 c)\n{\n    return c * a + (vec4(1) - c) * b;\n}\n\n// 4th type\nsubroutine(routine_type_4) bvec4 are_equal(in vec4 left, in vec4 right)\n{\n    return equal(left, right);\n}\n\nsubroutine(routine_type_4) bvec4 are_greater(in vec4 left, in vec4 right)\n{\n    return greaterThan(left, right);\n}\n\n// Sub routine uniforms\nsubroutine uniform routine_type_1 first_routine;\nsubroutine uniform routine_type_2 second_routine;\nsubroutine uniform routine_type_3 third_routine;\nsubroutine uniform routine_type_4 fourth_routine;\n\n// Input data\nuniform vec4 first_input;\nuniform vec4 second_input;\nuniform vec4 third_input;\n\n// Output\nout  vec4 out_result_from_first_routine;\nout  vec4 out_result_from_second_routine;\nout  vec4 out_result_from_third_routine;\nout uvec4 out_result_from_fourth_routine;\n\nvoid main()\n{\n    out_result_from_first_routine  =       first_routine (first_input, second_input);\n    out_result_from_second_routine =       second_routine(first_input);\n    out_result_from_third_routine  =       third_routine (first_input, second_input, third_input);\n    out_result_from_fourth_routine = uvec..." /* TRUNCATED STRING LITERAL */
               ,iterate::varying_names,4,false);
    iVar6 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar6) + 0x1680))(program.m_program_object_id);
    dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
    glu::checkError(dVar7,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x28f);
    Utils::vertexArray::generate(&vao);
    iVar6 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0xd8))(vao.m_id);
    dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
    glu::checkError(dVar7,"BindVertexArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x309);
    Utils::buffer::generate(&transform_feedback_buffer);
    Utils::buffer::update(&transform_feedback_buffer,0x8c8e,0x40,(GLvoid *)0x0,0x88ea);
    iVar6 = (*(transform_feedback_buffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x50))
              (0x8c8e,0,transform_feedback_buffer.m_id,0,0x40);
    dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x800))();
    glu::checkError(dVar7,"BindBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x4e);
    paGVar12 = this->m_subroutine_indices;
    papGVar13 = iterate::subroutine_names;
    lVar11 = 0;
    do {
      GVar8 = Utils::program::getSubroutineUniformLocation
                        (&program,iterate::subroutine_uniform_names[lVar11][0],0x8b31);
      this->m_subroutine_uniform_locations[lVar11][0] = GVar8;
      lVar10 = 0;
      do {
        GVar8 = Utils::program::getSubroutineIndex(&program,(*papGVar13)[lVar10],0x8b31);
        (*paGVar12)[lVar10] = GVar8;
        lVar10 = lVar10 + 1;
      } while (lVar10 == 1);
      lVar11 = lVar11 + 1;
      papGVar13 = papGVar13 + 1;
      paGVar12 = paGVar12 + 1;
    } while (lVar11 != 4);
    lVar11 = 0;
    do {
      GVar9 = Utils::program::getUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine15FunctionalTest57iterateEvE13uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine15FunctionalTest57iterateEvE13uniform_names_rel
                                                  + lVar11)));
      *(GLint *)((long)this->m_uniform_locations + lVar11) = GVar9;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    bVar5 = true;
    lVar11 = 0;
    do {
      subroutine_combination = (GLuint *)((long)iterate::subroutine_combinations[0] + lVar11);
      this_01 = this;
      testDraw(this,subroutine_combination,iterate::input_data,&first_routine_result,
               &second_routine_result,&third_routine_result,&fourth_routine_result);
      uVar1 = *(uint *)((long)iterate::subroutine_combinations[0] + lVar11);
      uVar2 = *(uint *)((long)iterate::subroutine_combinations[0] + lVar11 + 4);
      uVar3 = *(uint *)((long)iterate::subroutine_combinations[0] + lVar11 + 8);
      uVar4 = *(uint *)((long)iterate::subroutine_combinations[0] + lVar11 + 0xc);
      iVar6 = verify(this_01,(EVP_PKEY_CTX *)&first_routine_result,(uchar *)&second_routine_result,
                     (size_t)&third_routine_result,(uchar *)&fourth_routine_result,
                     (size_t)(iterate::expected_result_from_first_routine + uVar1));
      if ((char)iVar6 == '\0') {
        logError(this,iterate::subroutine_names,subroutine_combination,iterate::input_data,
                 &first_routine_result,&second_routine_result,&third_routine_result,
                 &fourth_routine_result,iterate::expected_result_from_first_routine + uVar1,
                 iterate::expected_result_from_second_routine + uVar2,
                 iterate::expected_result_from_third_routine + uVar3,
                 iterate::expected_result_from_fourth_routine + uVar4);
        bVar5 = false;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x100);
    __filename = (char *)(ulong)(uint)(byte)~bVar5;
    description = "Fail";
    if (bVar5) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar5,
               description);
    Utils::vertexArray::~vertexArray(&vao);
    Utils::buffer::~buffer(&transform_feedback_buffer);
    Utils::program::remove(&program,__filename);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  program._0_8_ = &program.m_tesselation_control_shader_id;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&program,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&program);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest5::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Subroutine types\n"
		"subroutine vec4  routine_type_1(in vec4 left, in vec4 right);\n"
		"subroutine vec4  routine_type_2(in vec4 iparam);\n"
		"subroutine vec4  routine_type_3(in vec4 a,    in vec4 b,    in vec4 c);\n"
		"subroutine bvec4 routine_type_4(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definitions\n"
		"// 1st type\n"
		"subroutine(routine_type_1) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type_1) vec4 subtract(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left - right;\n"
		"}\n"
		"\n"
		"// 2nd type\n"
		"subroutine(routine_type_2) vec4 square(in vec4 iparam)\n"
		"{\n"
		"    return iparam * iparam;\n"
		"}\n"
		"\n"
		"subroutine(routine_type_2) vec4 square_root(in vec4 iparam)\n"
		"{\n"
		"    return sqrt(iparam);\n"
		"}\n"
		"\n"
		"// 3rd type\n"
		"subroutine(routine_type_3) vec4 do_fma(in vec4 a, in vec4 b, in vec4 c)\n"
		"{\n"
		"    return fma(a, b, c);\n"
		"}\n"
		"\n"
		"subroutine(routine_type_3) vec4 blend(in vec4 a, in vec4 b, in vec4 c)\n"
		"{\n"
		"    return c * a + (vec4(1) - c) * b;\n"
		"}\n"
		"\n"
		"// 4th type\n"
		"subroutine(routine_type_4) bvec4 are_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return equal(left, right);\n"
		"}\n"
		"\n"
		"subroutine(routine_type_4) bvec4 are_greater(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return greaterThan(left, right);\n"
		"}\n"
		"\n"
		"// Sub routine uniforms\n"
		"subroutine uniform routine_type_1 first_routine;\n"
		"subroutine uniform routine_type_2 second_routine;\n"
		"subroutine uniform routine_type_3 third_routine;\n"
		"subroutine uniform routine_type_4 fourth_routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 first_input;\n"
		"uniform vec4 second_input;\n"
		"uniform vec4 third_input;\n"
		"\n"
		"// Output\n"
		"out  vec4 out_result_from_first_routine;\n"
		"out  vec4 out_result_from_second_routine;\n"
		"out  vec4 out_result_from_third_routine;\n"
		"out uvec4 out_result_from_fourth_routine;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_result_from_first_routine  =       first_routine (first_input, second_input);\n"
		"    out_result_from_second_routine =       second_routine(first_input);\n"
		"    out_result_from_third_routine  =       third_routine (first_input, second_input, third_input);\n"
		"    out_result_from_fourth_routine = uvec4(fourth_routine(first_input, second_input));\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[4][2] = {
		{ "add", "subtract" }, { "square", "square_root" }, { "do_fma", "blend" }, { "are_equal", "are_greater" }
	};

	static const GLchar* subroutine_uniform_names[4][1] = {
		{ "first_routine" }, { "second_routine" }, { "third_routine" }, { "fourth_routine" }
	};

	static const GLuint n_subroutine_types	 = sizeof(subroutine_names) / sizeof(subroutine_names[0]);
	static const GLuint n_subroutines_per_type = sizeof(subroutine_names[0]) / sizeof(subroutine_names[0][0]);
	static const GLuint n_subroutine_uniforms_per_type =
		sizeof(subroutine_uniform_names[0]) / sizeof(subroutine_uniform_names[0][0]);

	static const GLchar* uniform_names[] = { "first_input", "second_input", "third_input" };
	static const GLuint  n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	static const GLchar* varying_names[] = { "out_result_from_first_routine", "out_result_from_second_routine",
											 "out_result_from_third_routine", "out_result_from_fourth_routine" };
	static const GLuint n_varyings					   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varyings * sizeof(GLfloat) * 4 /* vec4 */;

	/* Test data */
	static const Utils::vec4<GLfloat> input_data[3] = { Utils::vec4<GLfloat>(1.0f, 4.0f, 9.0f, 16.0f),
														Utils::vec4<GLfloat>(16.0f, 9.0f, 4.0f, 1.0f),
														Utils::vec4<GLfloat>(0.25f, 0.5f, 0.75f, 1.0f) };

	static const Utils::vec4<GLfloat> expected_result_from_first_routine[2] = {
		Utils::vec4<GLfloat>(17.0f, 13.0f, 13.0f, 17.0f), Utils::vec4<GLfloat>(-15.0f, -5.0f, 5.0f, 15.0f)
	};

	static const Utils::vec4<GLfloat> expected_result_from_second_routine[2] = {
		Utils::vec4<GLfloat>(1.0f, 16.0f, 81.0f, 256.0f), Utils::vec4<GLfloat>(1.0f, 2.0f, 3.0f, 4.0f)
	};

	static const Utils::vec4<GLfloat> expected_result_from_third_routine[2] = {
		Utils::vec4<GLfloat>(16.25f, 36.5f, 36.75f, 17.0f), Utils::vec4<GLfloat>(12.25f, 6.5f, 7.75f, 16.0f)
	};

	static const Utils::vec4<GLuint> expected_result_from_fourth_routine[2] = { Utils::vec4<GLuint>(0, 0, 0, 0),
																				Utils::vec4<GLuint>(0, 0, 1, 1) };

	/* All combinations of subroutines */
	static const GLuint subroutine_combinations[][4] = {
		{ 0, 0, 0, 0 }, { 0, 0, 0, 1 }, { 0, 0, 1, 0 }, { 0, 0, 1, 1 }, { 0, 1, 0, 0 }, { 0, 1, 0, 1 },
		{ 0, 1, 1, 0 }, { 0, 1, 1, 1 }, { 1, 0, 0, 0 }, { 1, 0, 0, 1 }, { 1, 0, 1, 0 }, { 1, 0, 1, 1 },
		{ 1, 1, 0, 0 }, { 1, 1, 0, 1 }, { 1, 1, 1, 0 }, { 1, 1, 1, 1 }
	};
	static const GLuint n_subroutine_combinations =
		sizeof(subroutine_combinations) / sizeof(subroutine_combinations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Result */
	bool result = true;

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, varying_names,
				  n_varyings);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine uniform locations and subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		for (GLuint uniform = 0; uniform < n_subroutine_uniforms_per_type; ++uniform)
		{
			m_subroutine_uniform_locations[type][uniform] =
				program.getSubroutineUniformLocation(subroutine_uniform_names[type][uniform], GL_VERTEX_SHADER);
		}

		for (GLuint routine = 0; routine < n_subroutines_per_type; ++routine)
		{
			m_subroutine_indices[type][routine] =
				program.getSubroutineIndex(subroutine_names[type][routine], GL_VERTEX_SHADER);
		}
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Draw with each routine combination */
	for (GLuint i = 0; i < n_subroutine_combinations; ++i)
	{
		Utils::vec4<GLfloat> first_routine_result;
		Utils::vec4<GLfloat> second_routine_result;
		Utils::vec4<GLfloat> third_routine_result;
		Utils::vec4<GLuint>  fourth_routine_result;

		testDraw(subroutine_combinations[i], input_data, first_routine_result, second_routine_result,
				 third_routine_result, fourth_routine_result);

		if (false == verify(first_routine_result, second_routine_result, third_routine_result, fourth_routine_result,
							expected_result_from_first_routine[subroutine_combinations[i][0]],
							expected_result_from_second_routine[subroutine_combinations[i][1]],
							expected_result_from_third_routine[subroutine_combinations[i][2]],
							expected_result_from_fourth_routine[subroutine_combinations[i][3]]))
		{
			logError(subroutine_names, subroutine_combinations[i], input_data, first_routine_result,
					 second_routine_result, third_routine_result, fourth_routine_result,
					 expected_result_from_first_routine[subroutine_combinations[i][0]],
					 expected_result_from_second_routine[subroutine_combinations[i][1]],
					 expected_result_from_third_routine[subroutine_combinations[i][2]],
					 expected_result_from_fourth_routine[subroutine_combinations[i][3]]);

			result = false;
		}
	}

	/* Done */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return tcu::TestNode::STOP;
}